

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteCollectionFetchNextRecord(unqlite_col *pCol,jx9_value *pValue)

{
  int iVar1;
  jx9_int64 nId;
  
  nId = pCol->nCurid;
  do {
    if (pCol->nLastid <= nId) {
      pCol->nCurid = 0;
      return -0x12;
    }
    iVar1 = unqliteCollectionFetchRecordById(pCol,nId,pValue);
    nId = pCol->nCurid + 1;
    pCol->nCurid = nId;
  } while (iVar1 == -6);
  return iVar1;
}

Assistant:

UNQLITE_PRIVATE int unqliteCollectionFetchNextRecord(unqlite_col *pCol,jx9_value *pValue)
{
	int rc;
	for(;;){
		if( pCol->nCurid >= pCol->nLastid ){
			/* No more records, reset the record cursor ID */
			pCol->nCurid = 0;
			/* Return to the caller */
			return SXERR_EOF;
		}
		rc = unqliteCollectionFetchRecordById(pCol,pCol->nCurid,pValue);
		/* Increment the record ID */
		pCol->nCurid++;
		/* Lookup result */
		if( rc == UNQLITE_OK || rc != UNQLITE_NOTFOUND ){
			break;
		}
	}
	return rc;
}